

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::LazilyBuildDependenciesTest_Dependency_Test::TestBody
          (LazilyBuildDependenciesTest_Dependency_Test *this)

{
  bool bVar1;
  FileDescriptor *this_00;
  char *pcVar2;
  char *in_R9;
  string local_2c8;
  AssertHelper local_2a8;
  Message local_2a0;
  string_view local_298;
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_250;
  Message local_248;
  string_view local_240;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1f8;
  Message local_1f0;
  bool local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__4;
  FileDescriptor *bar_file;
  AssertHelper local_1a8;
  Message local_1a0;
  string_view local_198;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_150;
  Message local_148;
  string_view local_140;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_f8;
  Message local_f0;
  string_view local_e8;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_a0;
  Message local_98 [3];
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  FileDescriptor *foo_file;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  LazilyBuildDependenciesTest_Dependency_Test *local_10;
  LazilyBuildDependenciesTest_Dependency_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "\n        name: \'foo.proto\'\n        package: \'proto2_unittest\'\n        dependency: \'bar.proto\'\n        message_type {\n          name: \'Foo\'\n          field {\n            name: \'bar\'\n            number: 1\n            label: LABEL_OPTIONAL\n            type: TYPE_MESSAGE\n            type_name: \'.proto2_unittest.Bar\'\n          }\n        }\n      "
            );
  LazilyBuildDependenciesTest::ParseProtoAndAddToDb
            (&this->super_LazilyBuildDependenciesTest,local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\n        name: \'bar.proto\'\n        package: \'proto2_unittest\'\n        dependency: \'baz.proto\'\n        message_type {\n          name: \'Bar\'\n          field {\n            name: \'baz\'\n            number: 1\n            label: LABEL_OPTIONAL\n            type: TYPE_MESSAGE\n            type_name: \'.proto2_unittest.Baz\'\n          }\n        }\n      "
            );
  LazilyBuildDependenciesTest::ParseProtoAndAddToDb
            (&this->super_LazilyBuildDependenciesTest,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"baz");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&foo_file,"Baz");
  LazilyBuildDependenciesTest::AddSimpleMessageProtoFileToDb
            (&this->super_LazilyBuildDependenciesTest,local_40,_foo_file);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,"foo.proto");
  this_00 = DescriptorPool::FindFileByName
                      (&(this->super_LazilyBuildDependenciesTest).pool_,stack0xffffffffffffff98);
  local_79 = this_00 != (FileDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_78,
               (AssertionResult *)"foo_file != nullptr","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3adf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"foo.proto");
  local_d1 = DescriptorPool::InternalIsFileLoaded
                       (&(this->super_LazilyBuildDependenciesTest).pool_,local_e8);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_d0,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"foo.proto\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3ae1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_140,"bar.proto");
  local_129 = DescriptorPool::InternalIsFileLoaded
                        (&(this->super_LazilyBuildDependenciesTest).pool_,local_140);
  local_129 = !local_129;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_128,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"bar.proto\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3ae2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_198,"baz.proto");
  local_181 = DescriptorPool::InternalIsFileLoaded
                        (&(this->super_LazilyBuildDependenciesTest).pool_,local_198);
  local_181 = !local_181;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_180,&local_181,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&bar_file,(internal *)local_180,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"baz.proto\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3ae3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    std::__cxx11::string::~string((string *)&bar_file);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )FileDescriptor::dependency(this_00,0);
  local_1e1 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar__4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e0,&local_1e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_1e0,
               (AssertionResult *)"bar_file != nullptr","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3ae8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_240,"bar.proto");
  local_229 = DescriptorPool::InternalIsFileLoaded
                        (&(this->super_LazilyBuildDependenciesTest).pool_,local_240);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_228,&local_229,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_228,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"bar.proto\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3ae9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_298,"baz.proto");
  local_281 = DescriptorPool::InternalIsFileLoaded
                        (&(this->super_LazilyBuildDependenciesTest).pool_,local_298);
  local_281 = !local_281;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_280,&local_281,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)local_280,
               (AssertionResult *)"pool_.InternalIsFileLoaded(\"baz.proto\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3aea,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  return;
}

Assistant:

TEST_F(LazilyBuildDependenciesTest, Dependency) {
  ParseProtoAndAddToDb(
      R"pb(
        name: 'foo.proto'
        package: 'proto2_unittest'
        dependency: 'bar.proto'
        message_type {
          name: 'Foo'
          field {
            name: 'bar'
            number: 1
            label: LABEL_OPTIONAL
            type: TYPE_MESSAGE
            type_name: '.proto2_unittest.Bar'
          }
        }
      )pb");
  ParseProtoAndAddToDb(
      R"pb(
        name: 'bar.proto'
        package: 'proto2_unittest'
        dependency: 'baz.proto'
        message_type {
          name: 'Bar'
          field {
            name: 'baz'
            number: 1
            label: LABEL_OPTIONAL
            type: TYPE_MESSAGE
            type_name: '.proto2_unittest.Baz'
          }
        }
      )pb");
  AddSimpleMessageProtoFileToDb("baz", "Baz");

  const FileDescriptor* foo_file = pool_.FindFileByName("foo.proto");
  EXPECT_TRUE(foo_file != nullptr);
  // As expected, requesting foo.proto shouldn't build its dependencies
  EXPECT_TRUE(pool_.InternalIsFileLoaded("foo.proto"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("bar.proto"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("baz.proto"));

  // Verify calling dependency(N) will build the dependency, but
  // not that file's dependencies.
  const FileDescriptor* bar_file = foo_file->dependency(0);
  EXPECT_TRUE(bar_file != nullptr);
  EXPECT_TRUE(pool_.InternalIsFileLoaded("bar.proto"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("baz.proto"));
}